

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

ByteCodeUsesInstr * IR::ByteCodeUsesInstr::New(Func *func,uint32 offset)

{
  JitArenaAllocator *pJVar1;
  ByteCodeUsesInstr *this;
  TrackAllocData local_48;
  ByteCodeUsesInstr *local_20;
  ByteCodeUsesInstr *byteCodeUses;
  Func *pFStack_10;
  uint32 offset_local;
  Func *func_local;
  
  pJVar1 = func->m_alloc;
  byteCodeUses._4_4_ = offset;
  pFStack_10 = func;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
             ,0x38f);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_48);
  this = (ByteCodeUsesInstr *)new<Memory::JitArenaAllocator>(0x68,pJVar1,0x4e98c0);
  memset(this,0,0x68);
  ByteCodeUsesInstr(this);
  local_20 = this;
  Instr::Init((Instr *)this,ByteCodeUses,InstrKindByteCodeUses,pFStack_10);
  local_20->byteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  local_20->propertySymUse = (PropertySym *)0x0;
  Instr::SetByteCodeOffset(&local_20->super_Instr,byteCodeUses._4_4_);
  return local_20;
}

Assistant:

ByteCodeUsesInstr *
ByteCodeUsesInstr::New(Func * func, uint32 offset)
{
    ByteCodeUsesInstr * byteCodeUses = JitAnew(func->m_alloc, IR::ByteCodeUsesInstr);
    byteCodeUses->Init(Js::OpCode::ByteCodeUses, InstrKindByteCodeUses, func);
    byteCodeUses->byteCodeUpwardExposedUsed = nullptr;
    byteCodeUses->propertySymUse = nullptr;
    byteCodeUses->SetByteCodeOffset(offset);
    return byteCodeUses;
}